

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O0

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>
               (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                *container)

{
  iterator begin;
  iterator end;
  vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
  *container_local;
  
  if (container !=
      (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
       *)0x0) {
    begin = std::
            vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
            ::begin(container);
    end = std::
          vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
          ::end(container);
    STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::TextFormat::ParseInfoTree**,std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>>
              ((__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                )begin._M_current,
               (__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                )end._M_current);
    std::
    vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
    ::clear(container);
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}